

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

int testing::internal::
    CountIf<std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>,bool(*)(testing::TestSuite_const*)>
              (vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *c,
              _func_bool_TestSuite_ptr *predicate)

{
  bool bVar1;
  int iVar2;
  pointer ppTVar3;
  
  iVar2 = 0;
  for (ppTVar3 = (c->super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppTVar3 !=
      (c->super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; ppTVar3 = ppTVar3 + 1) {
    bVar1 = (*predicate)(*ppTVar3);
    iVar2 = iVar2 + (uint)bVar1;
  }
  return iVar2;
}

Assistant:

inline int CountIf(const Container& c, Predicate predicate) {
  // Implemented as an explicit loop since std::count_if() in libCstd on
  // Solaris has a non-standard signature.
  int count = 0;
  for (auto it = c.begin(); it != c.end(); ++it) {
    if (predicate(*it)) ++count;
  }
  return count;
}